

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_clear_icc(LodePNGInfo *info)

{
  long in_RDI;
  
  string_cleanup((char **)0x1061d5);
  lodepng_free((void *)0x1061e5);
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  *(undefined4 *)(in_RDI + 0x100) = 0;
  return;
}

Assistant:

void lodepng_clear_icc(LodePNGInfo* info)
{
  string_cleanup(&info->iccp_name);
  lodepng_free(info->iccp_profile);
  info->iccp_profile = NULL;
  info->iccp_profile_size = 0;
}